

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hoardsuperblockheader.h
# Opt level: O1

void __thiscall
Hoard::
EmptyClass<Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_8>
::transfer(EmptyClass<Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_8>
           *this,SuperblockType *s,int oldCl,int newCl)

{
  BlockType *pBVar1;
  BlockType *pBVar2;
  HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader> *pHVar3;
  
  pBVar1 = (s->_header).
           super_HoardSuperblockHeaderHelper<HL::SpinLockType,_262144,_Hoard::SmallHeap>._prev;
  pBVar2 = (s->_header).
           super_HoardSuperblockHeaderHelper<HL::SpinLockType,_262144,_Hoard::SmallHeap>._next;
  if (pBVar1 != (BlockType *)0x0) {
    (pBVar1->_header).super_HoardSuperblockHeaderHelper<HL::SpinLockType,_262144,_Hoard::SmallHeap>.
    _next = pBVar2;
  }
  if (pBVar2 != (BlockType *)0x0) {
    (pBVar2->_header).super_HoardSuperblockHeaderHelper<HL::SpinLockType,_262144,_Hoard::SmallHeap>.
    _prev = pBVar1;
  }
  if ((this->_available)._item[oldCl] == s) {
    (this->_available)._item[oldCl] = pBVar2;
  }
  (s->_header).super_HoardSuperblockHeaderHelper<HL::SpinLockType,_262144,_Hoard::SmallHeap>._next =
       (this->_available)._item[newCl];
  (s->_header).super_HoardSuperblockHeaderHelper<HL::SpinLockType,_262144,_Hoard::SmallHeap>._prev =
       (BlockType *)0x0;
  pHVar3 = (this->_available)._item[newCl];
  if (pHVar3 != (HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>
                 *)0x0) {
    (pHVar3->_header).super_HoardSuperblockHeaderHelper<HL::SpinLockType,_262144,_Hoard::SmallHeap>.
    _prev = s;
  }
  (this->_available)._item[newCl] = s;
  return;
}

Assistant:

BlockType* getPrev() const {
      return _prev;
    }